

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int archive_read_format_rar_cleanup(archive_read *a)

{
  archive_read *a_00;
  
  a_00 = (archive_read *)a->format->data;
  free_codes(a_00);
  delete_filter((rar_filter *)a_00->formats[3].data);
  delete_program_code((rar_program_code *)a_00->formats[2].has_encrypted_entries);
  free(a_00->formats[2].format_capabilties);
  free((a_00->archive).current_code);
  free(*(void **)&(a_00->archive).current_codepage);
  free(a_00->bidders[0].name);
  free(*(void **)&(a_00->client).nodes);
  free(a_00->formats[2].name);
  Ppmd7_Free((CPpmd7 *)&a_00->formats[3].seek_data);
  free(a_00);
  a->format->data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_read_format_rar_cleanup(struct archive_read *a)
{
  struct rar *rar;

  rar = (struct rar *)(a->format->data);
  free_codes(a);
  clear_filters(&rar->filters);
  free(rar->filename);
  free(rar->filename_save);
  free(rar->dbo);
  free(rar->unp_buffer);
  free(rar->lzss.window);
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
  free(rar);
  (a->format->data) = NULL;
  return (ARCHIVE_OK);
}